

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O1

void __thiscall luna::VM::Concat(VM *this,Value *dst,Value *op1,Value *op2)

{
  State *pSVar1;
  CFunctionType p_Var2;
  long *plVar3;
  undefined8 *puVar4;
  String *pSVar5;
  RuntimeException *this_00;
  size_type *psVar6;
  code *__s;
  pair<const_char_*,_int> pVar7;
  string local_70;
  string local_50;
  
  if (op1->type_ == ValueT_String) {
    if (op2->type_ == ValueT_String) {
      pSVar1 = this->state_;
      String::GetStdString_abi_cxx11_(&local_50,(op1->field_0).str_);
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar6 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70.field_2._8_8_ = puVar4[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_70._M_string_length = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      pSVar5 = State::GetString(pSVar1,&local_70);
      goto LAB_00127526;
    }
    if (op2->type_ == ValueT_Number) {
      p_Var2 = (op1->field_0).cfunc_;
      if (p_Var2[0x11] == (_func_int_State_ptr)0x0) {
        __s = p_Var2 + 0x18;
      }
      else {
        __s = *(code **)(p_Var2 + 0x18);
      }
      pSVar1 = this->state_;
      (anonymous_namespace)::NumberToStr_abi_cxx11_(&local_50,(_anonymous_namespace_ *)op2,op1);
      strlen((char *)__s);
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)__s);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar6 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70.field_2._8_8_ = puVar4[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_70._M_string_length = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      pSVar5 = State::GetString(pSVar1,&local_70);
      goto LAB_00127526;
    }
  }
  if ((op1->type_ != ValueT_Number) || (op2->type_ != ValueT_String)) {
    pVar7 = GetCurrentInstructionPos(this);
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x20);
    RuntimeException::RuntimeException(this_00,pVar7.first,pVar7.second,op1,op2,"concat");
    __cxa_throw(this_00,&RuntimeException::typeinfo,Exception::~Exception);
  }
  pSVar1 = this->state_;
  (anonymous_namespace)::NumberToStr_abi_cxx11_(&local_50,(_anonymous_namespace_ *)op1,op1);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70.field_2._8_8_ = plVar3[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_70._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pSVar5 = State::GetString(pSVar1,&local_70);
LAB_00127526:
  (dst->field_0).str_ = pSVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  dst->type_ = ValueT_String;
  return;
}

Assistant:

void VM::Concat(Value *dst, Value *op1, Value *op2)
    {
        if (op1->type_ == ValueT_String && op2->type_ == ValueT_String)
        {
            dst->str_ = state_->GetString(op1->str_->GetStdString() +
                                          op2->str_->GetCStr());
        }
        else if (op1->type_ == ValueT_String && op2->type_ == ValueT_Number)
        {
            dst->str_ = state_->GetString(op1->str_->GetCStr() +
                                          NumberToStr(op2));
        }
        else if (op1->type_ == ValueT_Number && op2->type_ == ValueT_String)
        {
            dst->str_ = state_->GetString(NumberToStr(op1) +
                                          op2->str_->GetCStr());
        }
        else
        {
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second, op1, op2, "concat");
        }

        dst->type_ = ValueT_String;
    }